

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap.cc
# Opt level: O0

bool __thiscall tcmalloc::PageHeap::EnsureLimit(PageHeap *this,Length n,bool withRelease)

{
  ulong uVar1;
  Length LVar2;
  long local_38;
  Length takenPages;
  Length limit;
  bool withRelease_local;
  Length n_local;
  PageHeap *this_local;
  
  uVar1 = (FLAG__namespace_do_not_use_directly_use_DECLARE_int64_t_instead::
           FLAGS_tcmalloc_heap_limit_mb << 0x14) >> 0xd;
  if (uVar1 == 0) {
    this_local._7_1_ = true;
  }
  else {
    local_38 = (TCMalloc_SystemTaken >> 0xd) - ((this->stats_).unmapped_bytes >> 0xd);
    if ((uVar1 < local_38 + n) && (withRelease)) {
      LVar2 = ReleaseAtLeastNPages(this,(local_38 + n) - uVar1);
      local_38 = local_38 - LVar2;
    }
    this_local._7_1_ = local_38 + n <= uVar1;
  }
  return this_local._7_1_;
}

Assistant:

bool PageHeap::EnsureLimit(Length n, bool withRelease) {
  ASSERT(lock_.IsHeld());
  Length limit = (FLAGS_tcmalloc_heap_limit_mb*1024*1024) >> kPageShift;
  if (limit == 0) return true; //there is no limit

  // We do not use stats_.system_bytes because it does not take
  // MetaDataAllocs into account.
  Length takenPages = TCMalloc_SystemTaken >> kPageShift;
  //XXX takenPages may be slightly bigger than limit for two reasons:
  //* MetaDataAllocs ignore the limit (it is not easy to handle
  //  out of memory there)
  //* sys_alloc may round allocation up to huge page size,
  //  although smaller limit was ensured

  ASSERT(takenPages >= stats_.unmapped_bytes >> kPageShift);
  takenPages -= stats_.unmapped_bytes >> kPageShift;

  if (takenPages + n > limit && withRelease) {
    takenPages -= ReleaseAtLeastNPages(takenPages + n - limit);
  }

  return takenPages + n <= limit;
}